

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O0

void __thiscall
cs_impl::any::holder<cs::callable>::holder<cs::function&>(holder<cs::callable> *this,function *args)

{
  baseHolder *in_RDI;
  function *__f;
  callable *in_stack_ffffffffffffffc0;
  
  baseHolder::baseHolder(in_RDI);
  in_RDI->_vptr_baseHolder = (_func_int **)&PTR__holder_003b6050;
  __f = (function *)(in_RDI + 1);
  std::function<cs_impl::any(std::vector<cs_impl::any,std::allocator<cs_impl::any>>&)>::
  function<cs::function&,void>(&in_stack_ffffffffffffffc0->mFunc,__f);
  cs::callable::callable
            (in_stack_ffffffffffffffc0,(function_type *)__f,(types)((ulong)in_RDI >> 0x20));
  std::function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>::
  ~function((function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)> *)
            0x1f06a7);
  return;
}

Assistant:

explicit holder(ArgsT &&...args):mDat(std::forward<ArgsT>(args)...) {}